

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O0

void __thiscall
iDynTree::XMLElement::XMLElementPimpl::XMLElementPimpl
          (XMLElementPimpl *this,XMLParserState *parserState,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *attributes)

{
  string *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  string *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *puVar1;
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  *in_stack_ffffffffffffffa0;
  
  std::
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  ::function(in_stack_ffffffffffffffa0);
  std::function<void_()>::function((function<void_()> *)in_stack_ffffffffffffffa0);
  std::function<void_(std::shared_ptr<iDynTree::XMLElement>)>::function
            ((function<void_(std::shared_ptr<iDynTree::XMLElement>)> *)in_stack_ffffffffffffffa0);
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 0x60));
  this_00 = (string *)(in_RDI + 0x1e8);
  std::__cxx11::string::string(this_00,in_RDX);
  puVar1 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
            *)(in_RDI + 0x208);
  std::
  vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::vector((vector<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
            *)0x13274c);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
                   *)this_00,puVar1);
  *(undefined8 *)(in_RDI + 600) = in_RSI;
  return;
}

Assistant:

explicit XMLElementPimpl(XMLParserState& parserState,
                                 const std::string& name,
                                 const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>>& attributes)
                                 : m_name(name), m_attributes(attributes), m_parserState(parserState) {}